

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

void am_generalize_script_double_click_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *list_value;
  Am_Object scroll_menu;
  Am_Value_List sel_list;
  Am_Object script_window;
  Am_Object AStack_28;
  Am_Value_List local_20;
  Am_Object local_10;
  
  Am_Object::Get_Object((Am_Object *)&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)&local_20,10);
  Am_Object::~Am_Object((Am_Object *)&local_20);
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)&AStack_28,10);
  list_value = Am_Object::Get(&AStack_28,0x171,3);
  Am_Value_List::Am_Value_List(&local_20,list_value);
  bVar1 = Am_Value_List::Valid(&local_20);
  if (bVar1) {
    Am_Pop_Up_Generalize_DB(&local_10,&local_20);
  }
  Am_Value_List::~Am_Value_List(&local_20);
  Am_Object::~Am_Object(&local_10);
  Am_Object::~Am_Object(&AStack_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_generalize_script_double_click,
                 (Am_Object cmd))
{
  //cmd in inter on scroll_menu on script_window
  Am_Object scroll_menu = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object script_window = scroll_menu.Get_Owner();
  Am_Value_List sel_list =
      scroll_menu.Get(Am_SAVED_OLD_OBJECT_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (sel_list.Valid())
    Am_Pop_Up_Generalize_DB(script_window, sel_list);
}